

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warning.cpp
# Opt level: O2

bool tryProcessParamWarning(char *flag,uint8_t param,WarningState state)

{
  int iVar1;
  ulong uVar2;
  WarningState WVar3;
  size_t i;
  ulong uVar4;
  byte bVar5;
  anon_struct_16_3_e9a1e028 *paVar6;
  WarningState *pWVar7;
  
  pWVar7 = warningStates + 0x10;
  paVar6 = paramWarnings;
  uVar4 = 0;
  while( true ) {
    if (uVar4 == 3) goto LAB_00113f1e;
    iVar1 = strcmp(paVar6->name,flag);
    if (iVar1 == 0) break;
    uVar4 = uVar4 + 1;
    pWVar7 = pWVar7 + 2;
    paVar6 = paVar6 + 1;
  }
  if (param == '\0' && state != WARNING_DISABLED) {
    bVar5 = paVar6->defaultLevel;
  }
  else {
    bVar5 = param;
    if ((2 < param) && (bVar5 = 2, param != 0xff)) {
      warnx("Got parameter %u for warning flag \"%s\", but the maximum is %u; capping.\n",
            (ulong)param,flag);
    }
  }
  for (uVar2 = 0; uVar2 != 2; uVar2 = uVar2 + 1) {
    WVar3 = WARNING_DISABLED;
    if (uVar2 < bVar5) {
      WVar3 = state;
    }
    *pWVar7 = WVar3;
    pWVar7 = pWVar7 + 1;
  }
LAB_00113f1e:
  return uVar4 < 3;
}

Assistant:

static bool tryProcessParamWarning(char const *flag, uint8_t param, enum WarningState state)
{
	enum WarningID baseID = PARAM_WARNINGS_START;

	for (size_t i = 0; i < ARRAY_SIZE(paramWarnings); i++) {
		uint8_t maxParam = paramWarnings[i].nbLevels;

		if (!strcmp(paramWarnings[i].name, flag)) { // Match!
			// If making the warning an error but param is 0, set to the maximum
			// This accommodates `-Werror=flag`, but also `-Werror=flag=0`, which is
			// thus filtered out by the caller.
			// A param of 0 makes sense for disabling everything, but neither for
			// enabling nor "erroring". Use the default for those.
			if (param == 0 && state != WARNING_DISABLED) {
				param = paramWarnings[i].defaultLevel;
			} else if (param > maxParam) {
				if (param != 255) // Don't  warn if already capped
					warnx("Got parameter %" PRIu8
					      " for warning flag \"%s\", but the maximum is %"
					      PRIu8 "; capping.\n",
					      param, flag, maxParam);
				param = maxParam;
			}

			// Set the first <param> to enabled/error, and disable the rest
			for (uint8_t ofs = 0; ofs < maxParam; ofs++) {
				warningStates[baseID + ofs] =
					ofs < param ? state : WARNING_DISABLED;
			}
			return true;
		}

		baseID = (enum WarningID)(baseID + maxParam);
	}
	return false;
}